

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

string * GenerateId_abi_cxx11_(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  time_t tVar8;
  string *in_RDI;
  allocator local_95;
  uint local_94;
  string *local_90;
  char str_uuid [80];
  
  local_90 = in_RDI;
  tVar8 = time((time_t *)0x0);
  srand((uint)tVar8);
  local_94 = rand();
  uVar1 = rand();
  uVar2 = rand();
  uVar3 = rand();
  iVar4 = rand();
  uVar5 = rand();
  uVar6 = rand();
  uVar7 = rand();
  snprintf(str_uuid,0x50,"%x%x-%x-%x-%x-%x%x%x",(ulong)local_94,(ulong)uVar1,(ulong)uVar2,
           (ulong)(uVar3 & 0xfff | 0x4000),(ulong)(iVar4 % 0x3fff + 0x8000),(ulong)uVar5,
           (ulong)uVar6,(ulong)uVar7);
  std::__cxx11::string::string((string *)local_90,str_uuid,&local_95);
  return local_90;
}

Assistant:

std::string GenerateId() {
    char str_uuid[80];
    srand(time(NULL));
    snprintf(str_uuid, sizeof(str_uuid),
             "%x%x-%x-%x-%x-%x%x%x",
             rand(),
             rand(),
             rand(),
             ((rand() & 0x0fff) | 0x4000),
             rand() % 0x3fff + 0x8000,
             rand(),
             rand(),
             rand());
    return str_uuid;
}